

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O3

void bk_lib::detail::fill<Clasp::DefaultUnfoundedCheck::BodyData>
               (BodyData *first,BodyData *last,BodyData *x)

{
  switch((uint)((int)last - (int)first) >> 3 & 7) {
  case 0:
    for (; first != last; first = first + 1) {
      *first = *x;
      first = first + 1;
switchD_00178bcc_caseD_7:
      *first = *x;
      first = first + 1;
switchD_00178bcc_caseD_6:
      *first = *x;
      first = first + 1;
switchD_00178bcc_caseD_5:
      *first = *x;
      first = first + 1;
switchD_00178bcc_caseD_4:
      *first = *x;
      first = first + 1;
switchD_00178bcc_caseD_3:
      *first = *x;
      first = first + 1;
switchD_00178bcc_caseD_2:
      *first = *x;
      first = first + 1;
switchD_00178bcc_caseD_1:
      *first = *x;
    }
    break;
  case 1:
    goto switchD_00178bcc_caseD_1;
  case 2:
    goto switchD_00178bcc_caseD_2;
  case 3:
    goto switchD_00178bcc_caseD_3;
  case 4:
    goto switchD_00178bcc_caseD_4;
  case 5:
    goto switchD_00178bcc_caseD_5;
  case 6:
    goto switchD_00178bcc_caseD_6;
  case 7:
    goto switchD_00178bcc_caseD_7;
  }
  return;
}

Assistant:

void fill(T* first, T* last, const T& x) {
		assert(first <= last);
		switch ((last - first) & 7u)
		{
		case 0:
				while (first != last)
				{
				new(first++) T(x);
		case 7: new(first++) T(x);
		case 6: new(first++) T(x);
		case 5: new(first++) T(x);
		case 4: new(first++) T(x);
		case 3: new(first++) T(x);
		case 2: new(first++) T(x);
		case 1: new(first++) T(x);
				assert(first <= last);
				}
		}
	}